

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall
pstore::database::database(database *this,string *path,access_mode am,bool access_tick_enabled)

{
  typed_address<pstore::trailer> tVar1;
  
  this->_vptr_database = (_func_int **)&PTR__database_0025de80;
  open((database *)&stack0xffffffffffffffc8,(char *)path,am);
  storage::storage<pstore::file::file_handle>
            (&this->storage_,(shared_ptr<pstore::file::file_handle> *)&stack0xffffffffffffffc8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  (this->lock_)._M_device = (mutex_type *)0x0;
  (this->lock_)._M_owns = false;
  this->vacuum_mode_ = disabled;
  this->modified_ = false;
  this->closed_ = false;
  (this->header_).super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->header_).super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->range_lock_).file_ = (file_base *)0x0;
  (this->range_lock_).offset_ = 0;
  *(undefined8 *)((long)&(this->range_lock_).offset_ + 5) = 0;
  *(undefined8 *)((long)&(this->range_lock_).size_ + 5) = 0;
  tVar1 = get_footer_pos<pstore::file::file_base>
                    ((this->storage_).file_.
                     super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  (this->size_).footer_pos_.a_.a_ = (value_type)tVar1.a_.a_;
  (this->size_).logical_ = (long)tVar1.a_.a_ + 0x70;
  (this->indices_)._M_elems[0].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->indices_)._M_elems[0].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->indices_)._M_elems[1].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->indices_)._M_elems[1].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->indices_)._M_elems[2].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->indices_)._M_elems[2].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->indices_)._M_elems[3].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->indices_)._M_elems[3].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->indices_)._M_elems[4].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->indices_)._M_elems[4].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->indices_)._M_elems[5].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->indices_)._M_elems[5].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->sync_name_)._M_dataplus._M_p = (pointer)&(this->sync_name_).field_2;
  (this->sync_name_)._M_string_length = 0;
  (this->sync_name_).field_2._M_local_buf[0] = '\0';
  finish_init(this,false);
  return;
}

Assistant:

database::database (std::string const & path, access_mode const am,
                        bool const access_tick_enabled)
            : storage_{database::open (path, am)}
            , size_{database::get_footer_pos (*this->file ())} {

        this->finish_init (access_tick_enabled);
    }